

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

VariablePtr __thiscall libcellml::Variable::equivalentVariable(Variable *this,size_t index)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  weak_ptr<libcellml::Variable> *variableWeak;
  long lVar4;
  VariablePtr VVar5;
  
  lVar1 = *(long *)(*(long *)(index + 8) + 0x60);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var2._M_pi = in_RDX;
  for (lVar4 = *(long *)(*(long *)(index + 8) + 0x58); lVar4 != lVar1; lVar4 = lVar4 + 0x10) {
    std::__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)this,lVar4);
    if ((this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity !=
        (_func_int **)0x0) {
      _Var2._M_pi = extraout_RDX;
      if (p_Var3 == in_RDX) goto LAB_0022cf2f;
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&p_Var3->_vptr__Sp_counted_base + 1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl);
    _Var2._M_pi = extraout_RDX_00;
  }
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity = (_func_int **)0x0;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl = (EntityImpl *)0x0;
LAB_0022cf2f:
  VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (VariablePtr)VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr Variable::equivalentVariable(size_t index) const
{
    size_t count = 0;
    for (const auto &variableWeak : pFunc()->mEquivalentVariables) {
        auto variable = variableWeak.lock();
        if (variable != nullptr) {
            if (count == index) {
                return variable;
            }
            ++count;
        }
    }

    return nullptr;
}